

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

char * fmt::v6::internal::
       parse_format_specs<char,fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_>
                 *handler)

{
  undefined1 *puVar1;
  basic_format_specs<char> *pbVar2;
  byte bVar3;
  specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_>
  *in_RAX;
  byte *pbVar4;
  type tVar5;
  uint uVar6;
  char *message;
  byte *pbVar7;
  width_adapter<fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_>_&,_char>
  local_18;
  
  if (begin == end) {
    return begin;
  }
  if (*begin == '}') {
    return begin;
  }
  local_18.handler = in_RAX;
  pbVar4 = (byte *)parse_align<char,fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>>&>
                             (begin,end,handler);
  if (pbVar4 == (byte *)end) {
    return (char *)pbVar4;
  }
  bVar3 = *pbVar4;
  if (bVar3 == 0x20) {
    tVar5 = (handler->checker_).arg_type_;
    uVar6 = tVar5 - named_arg_type;
    if (uVar6 < 0xc) {
      bVar3 = 0x30;
LAB_0012dbc7:
      if ((uVar6 < 9) &&
         ((char_type < tVar5 || ((0x214U >> (tVar5 & (custom_type|pointer_type)) & 1) == 0)))) {
        message = "format specifier requires signed argument";
        goto LAB_0012dd17;
      }
      pbVar2 = (handler->
               super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
               ).super_specs_setter<char>.specs_;
      pbVar2->field_0x9 = pbVar2->field_0x9 & 0x8f | bVar3;
      pbVar4 = pbVar4 + 1;
LAB_0012dbf4:
      if (pbVar4 == (byte *)end) {
        return (char *)pbVar4;
      }
      bVar3 = *pbVar4;
      if (bVar3 == 0x23) {
        if (0xb < (handler->checker_).arg_type_ - named_arg_type) goto LAB_0012dd10;
        puVar1 = &((handler->
                   super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
                   ).super_specs_setter<char>.specs_)->field_0x9;
        *puVar1 = *puVar1 | 0x80;
        pbVar4 = pbVar4 + 1;
        if (pbVar4 == (byte *)end) {
          return (char *)pbVar4;
        }
        bVar3 = *pbVar4;
      }
      if (bVar3 == 0x30) {
        if (0xb < (handler->checker_).arg_type_ - named_arg_type) goto LAB_0012dd10;
        pbVar2 = (handler->
                 super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
                 ).super_specs_setter<char>.specs_;
        pbVar2->field_0x9 = pbVar2->field_0x9 & 0xf0 | 4;
        (((handler->
          super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
          ).super_specs_setter<char>.specs_)->fill).data_[0] = '0';
        pbVar4 = pbVar4 + 1;
        if (pbVar4 == (byte *)end) {
          return (char *)pbVar4;
        }
        bVar3 = *pbVar4;
      }
      if ((byte)(bVar3 - 0x30) < 10) {
        uVar6 = 0;
        pbVar7 = pbVar4;
        do {
          pbVar7 = pbVar7 + 1;
          if (0xccccccc < uVar6) goto LAB_0012dd07;
          uVar6 = ((uint)bVar3 + uVar6 * 10) - 0x30;
          pbVar4 = (byte *)end;
        } while ((pbVar7 != (byte *)end) &&
                (bVar3 = *pbVar7, pbVar4 = pbVar7, (byte)(bVar3 - 0x30) < 10));
        if ((int)uVar6 < 0) {
LAB_0012dd07:
          message = "number is too big";
          goto LAB_0012dd17;
        }
        ((handler->
         super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
         ).super_specs_setter<char>.specs_)->width = uVar6;
      }
      else {
        if (bVar3 != 0x7b) goto LAB_0012dcd5;
        pbVar4 = pbVar4 + 1;
        if (pbVar4 != (byte *)end) {
          local_18.handler = handler;
          pbVar4 = (byte *)parse_arg_id<char,fmt::v6::internal::width_adapter<fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>>&,char>>
                                     ((char *)pbVar4,end,&local_18);
        }
        if ((pbVar4 == (byte *)end) || (*pbVar4 != 0x7d)) {
          message = "invalid format string";
          goto LAB_0012dd17;
        }
        pbVar4 = pbVar4 + 1;
      }
      if (pbVar4 == (byte *)end) {
        return (char *)pbVar4;
      }
LAB_0012dcd5:
      if (*pbVar4 == 0x2e) {
        pbVar4 = (byte *)parse_precision<char,fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>>&>
                                   ((char *)pbVar4,end,handler);
      }
      if ((pbVar4 != (byte *)end) && (bVar3 = *pbVar4, bVar3 != 0x7d)) {
        pbVar4 = pbVar4 + 1;
        ((handler->
         super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
         ).super_specs_setter<char>.specs_)->type = bVar3;
      }
      return (char *)pbVar4;
    }
  }
  else if (bVar3 == 0x2d) {
    tVar5 = (handler->checker_).arg_type_;
    uVar6 = tVar5 - named_arg_type;
    if (uVar6 < 0xc) {
      bVar3 = 0x10;
      goto LAB_0012dbc7;
    }
  }
  else {
    if (bVar3 != 0x2b) goto LAB_0012dbf4;
    tVar5 = (handler->checker_).arg_type_;
    uVar6 = tVar5 - named_arg_type;
    if (uVar6 < 0xc) {
      bVar3 = 0x20;
      goto LAB_0012dbc7;
    }
  }
LAB_0012dd10:
  message = "format specifier requires numeric argument";
LAB_0012dd17:
  error_handler::on_error((error_handler *)&local_18,message);
}

Assistant:

FMT_CONSTEXPR const Char* parse_format_specs(const Char* begin, const Char* end,
                                             SpecHandler&& handler) {
  if (begin == end || *begin == '}') return begin;

  begin = parse_align(begin, end, handler);
  if (begin == end) return begin;

  // Parse sign.
  switch (static_cast<char>(*begin)) {
  case '+':
    handler.on_plus();
    ++begin;
    break;
  case '-':
    handler.on_minus();
    ++begin;
    break;
  case ' ':
    handler.on_space();
    ++begin;
    break;
  }
  if (begin == end) return begin;

  if (*begin == '#') {
    handler.on_hash();
    if (++begin == end) return begin;
  }

  // Parse zero flag.
  if (*begin == '0') {
    handler.on_zero();
    if (++begin == end) return begin;
  }

  begin = parse_width(begin, end, handler);
  if (begin == end) return begin;

  // Parse precision.
  if (*begin == '.') {
    begin = parse_precision(begin, end, handler);
  }

  // Parse type.
  if (begin != end && *begin != '}') handler.on_type(*begin++);
  return begin;
}